

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

RecyclerWeakReference<const_Js::PropertyRecord> * __thiscall
JsUtil::
List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::CompactEnd<true>(List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *this)

{
  WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_> *pWVar1;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  int iVar6;
  
  iVar6 = (this->
          super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
          ).count;
  if (iVar6 != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if ((this->
          super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
          ).buffer.ptr[iVar6 + -1].ptr == (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                           ,0x1bd,"(!weaklyRefItems || (this->buffer[this->count - 1] != nullptr))",
                           "!weaklyRefItems || (this->buffer[this->count - 1] != nullptr)");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      pWVar1 = (this->
               super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr;
      iVar6 = (this->
              super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
              ).count + -1;
      pRVar2 = pWVar1[iVar6].ptr;
      if ((pRVar2->super_RecyclerWeakReferenceBase).strongRef != (Type)0x0) {
        return pRVar2;
      }
      (this->
      super_ReadOnlyList<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_DefaultComparer>
      ).count = iVar6;
      pWVar1[iVar6].ptr = (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0;
    } while (iVar6 != 0);
  }
  return (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0;
}

Assistant:

T CompactEnd()
        {
            while (this->count != 0)
            {
                AnalysisAssert(!weaklyRefItems || (this->buffer[this->count - 1] != nullptr));
                if (weaklyRefItems ?
                    this->buffer[this->count - 1]->Get() != nullptr :
                    this->buffer[this->count - 1] != nullptr)
                {
                    return this->buffer[this->count - 1];
                }
                this->count--;
                this->buffer[this->count] = nullptr;
            }

            return nullptr;
        }